

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall icu_63::CollationDataBuilder::clearContexts(CollationDataBuilder *this)

{
  UTrie2 *trie;
  UBool UVar1;
  UChar32 c;
  uint32_t ce32_00;
  ConditionalCE32 *pCVar2;
  char *in_RSI;
  uint32_t ce32;
  undefined1 local_50 [8];
  UnicodeSetIterator iter;
  CollationDataBuilder *this_local;
  
  iter.cpString = (UnicodeString *)this;
  UnicodeString::remove(&this->contexts,in_RSI);
  UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)local_50,&this->contextChars);
  while( true ) {
    UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)local_50);
    if (UVar1 == '\0') break;
    trie = this->trie;
    c = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)local_50);
    ce32_00 = utrie2_get32_63(trie,c);
    pCVar2 = getConditionalCE32ForCE32(this,ce32_00);
    pCVar2->builtCE32 = 1;
  }
  UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)local_50);
  return;
}

Assistant:

void
CollationDataBuilder::clearContexts() {
    contexts.remove();
    UnicodeSetIterator iter(contextChars);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        uint32_t ce32 = utrie2_get32(trie, iter.getCodepoint());
        U_ASSERT(isBuilderContextCE32(ce32));
        getConditionalCE32ForCE32(ce32)->builtCE32 = Collation::NO_CE32;
    }
}